

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void shift_and_clamp_sse4_1(__m128i *in0,__m128i *in1,__m128i *clamp_lo,__m128i *clamp_hi,int shift)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  
  iVar4 = (1 << ((byte)shift & 0x1f)) >> 1;
  auVar21 = ZEXT416((uint)shift);
  iVar13 = (int)(*in0)[0] + iVar4 >> auVar21;
  iVar15 = *(int *)((long)*in0 + 4) + iVar4 >> auVar21;
  iVar17 = (int)(*in0)[1] + iVar4 >> auVar21;
  iVar19 = *(int *)((long)*in0 + 0xc) + iVar4 >> auVar21;
  iVar5 = iVar4 + (int)(*in1)[0] >> auVar21;
  iVar7 = iVar4 + *(int *)((long)*in1 + 4) >> auVar21;
  iVar9 = iVar4 + (int)(*in1)[1] >> auVar21;
  iVar11 = iVar4 + *(int *)((long)*in1 + 0xc) >> auVar21;
  iVar4 = (int)(*clamp_lo)[0];
  iVar1 = *(int *)((long)*clamp_lo + 4);
  iVar2 = (int)(*clamp_lo)[1];
  iVar3 = *(int *)((long)*clamp_lo + 0xc);
  uVar14 = (uint)(iVar13 < iVar4) * iVar4 | (uint)(iVar13 >= iVar4) * iVar13;
  uVar16 = (uint)(iVar15 < iVar1) * iVar1 | (uint)(iVar15 >= iVar1) * iVar15;
  uVar18 = (uint)(iVar17 < iVar2) * iVar2 | (uint)(iVar17 >= iVar2) * iVar17;
  uVar20 = (uint)(iVar19 < iVar3) * iVar3 | (uint)(iVar19 >= iVar3) * iVar19;
  iVar13 = (int)(*clamp_hi)[0];
  iVar15 = *(int *)((long)*clamp_hi + 4);
  iVar17 = (int)(*clamp_hi)[1];
  iVar19 = *(int *)((long)*clamp_hi + 0xc);
  uVar6 = (uint)(iVar5 < iVar4) * iVar4 | (uint)(iVar5 >= iVar4) * iVar5;
  uVar8 = (uint)(iVar7 < iVar1) * iVar1 | (uint)(iVar7 >= iVar1) * iVar7;
  uVar10 = (uint)(iVar9 < iVar2) * iVar2 | (uint)(iVar9 >= iVar2) * iVar9;
  uVar12 = (uint)(iVar11 < iVar3) * iVar3 | (uint)(iVar11 >= iVar3) * iVar11;
  *(uint *)*in0 = (uint)(iVar13 < (int)uVar14) * iVar13 | (iVar13 >= (int)uVar14) * uVar14;
  *(uint *)((long)*in0 + 4) =
       (uint)(iVar15 < (int)uVar16) * iVar15 | (iVar15 >= (int)uVar16) * uVar16;
  *(uint *)(*in0 + 1) = (uint)(iVar17 < (int)uVar18) * iVar17 | (iVar17 >= (int)uVar18) * uVar18;
  *(uint *)((long)*in0 + 0xc) =
       (uint)(iVar19 < (int)uVar20) * iVar19 | (iVar19 >= (int)uVar20) * uVar20;
  *(uint *)*in1 = (uint)(iVar13 < (int)uVar6) * iVar13 | (iVar13 >= (int)uVar6) * uVar6;
  *(uint *)((long)*in1 + 4) = (uint)(iVar15 < (int)uVar8) * iVar15 | (iVar15 >= (int)uVar8) * uVar8;
  *(uint *)(*in1 + 1) = (uint)(iVar17 < (int)uVar10) * iVar17 | (iVar17 >= (int)uVar10) * uVar10;
  *(uint *)((long)*in1 + 0xc) =
       (uint)(iVar19 < (int)uVar12) * iVar19 | (iVar19 >= (int)uVar12) * uVar12;
  return;
}

Assistant:

static void shift_and_clamp_sse4_1(__m128i *in0, __m128i *in1,
                                   const __m128i *clamp_lo,
                                   const __m128i *clamp_hi, int shift) {
  __m128i offset = _mm_set1_epi32((1 << shift) >> 1);
  __m128i in0_w_offset = _mm_add_epi32(*in0, offset);
  __m128i in1_w_offset = _mm_add_epi32(*in1, offset);

  in0_w_offset = _mm_sra_epi32(in0_w_offset, _mm_cvtsi32_si128(shift));
  in1_w_offset = _mm_sra_epi32(in1_w_offset, _mm_cvtsi32_si128(shift));

  in0_w_offset = _mm_max_epi32(in0_w_offset, *clamp_lo);
  in0_w_offset = _mm_min_epi32(in0_w_offset, *clamp_hi);
  in1_w_offset = _mm_max_epi32(in1_w_offset, *clamp_lo);
  in1_w_offset = _mm_min_epi32(in1_w_offset, *clamp_hi);

  *in0 = in0_w_offset;
  *in1 = in1_w_offset;
}